

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool generate_starburst_room
                (chunk *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,_Bool light,wchar_t feat,
                _Bool special_ok)

{
  ulong uVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  wchar_t wVar8;
  loc lVar9;
  monster *pmVar10;
  object *poVar11;
  loc_conflict grid1;
  square *psVar12;
  loc grid;
  uint uVar13;
  wchar_t wVar14;
  int iVar15;
  int iVar16;
  wchar_t wVar17;
  ulong uVar18;
  int iVar19;
  wchar_t wVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  bool bVar27;
  wchar_t local_200;
  int iStack_1a0;
  wchar_t local_19c;
  wchar_t arc [45] [2];
  
  lVar9 = (loc)loc(x1,y1);
  _Var2 = square_in_bounds((chunk_conflict *)c,lVar9);
  if (_Var2) {
    lVar9 = (loc)loc(x2,y2);
    _Var2 = square_in_bounds((chunk_conflict *)c,lVar9);
    if ((_Var2) && (x1 + L'\x02' < x2 && y1 + L'\x02' < y2)) {
      iVar4 = y2 - y1;
      iVar19 = iVar4 + 1;
      iVar5 = x2 - x1;
      iVar21 = iVar5 + 1;
      if (((iVar21 * 5) / 2 < iVar19) || ((iVar19 * 5) / 2 < iVar21)) {
        if (iVar21 < iVar19) {
          wVar17 = (iVar19 * 2) / 3 + y1;
          wVar20 = x2;
        }
        else {
          wVar20 = (iVar21 * 2) / 3 + x1;
          wVar17 = y2;
        }
        generate_starburst_room(c,y1,x1,wVar17,wVar20,light,feat,false);
        if (iVar21 < iVar19) {
          wVar8 = iVar19 / 3 + y1;
          wVar14 = x1;
        }
        else {
          wVar14 = iVar21 / 3 + x1;
          wVar8 = y1;
        }
        generate_starburst_room(c,wVar8,wVar14,y2,x2,light,feat,false);
        _Var2 = feat_is_floor(feat);
        if (_Var2) {
          iVar4 = (wVar17 + y1) / 2;
          iVar5 = (wVar8 + y2) / 2;
          if (iVar5 < iVar4) {
            return true;
          }
          iVar23 = (wVar20 + x1) / 2;
          iVar21 = (wVar14 + x2) / 2;
          iVar19 = iVar21;
          if (iVar21 < iVar23) {
            iVar19 = iVar23;
          }
          do {
            iVar16 = iVar23;
            if (iVar23 <= iVar21) {
              do {
                lVar9 = (loc)loc(iVar16,iVar4);
                square_set_feat((chunk_conflict *)c,lVar9,feat);
                iVar16 = iVar16 + 1;
              } while (iVar19 + 1 != iVar16);
            }
            bVar27 = iVar4 != iVar5;
            iVar4 = iVar4 + 1;
          } while (bVar27);
        }
        else {
          if (iVar21 < iVar19) {
            wVar17 = (iVar4 - iVar5) / 2 + y1;
          }
          else {
            iVar4 = (iVar5 - iVar4) / 2;
            x1 = x1 + iVar4;
            x2 = iVar4 + x1;
            wVar17 = y1;
            y1 = y2;
          }
          generate_starburst_room(c,wVar17,x1,y1,x2,light,feat,false);
        }
      }
      else {
        iVar23 = 10;
        if (0x2c < iVar19 || 0x2c < iVar21) {
          iVar23 = iVar19;
          if (iVar19 < iVar21) {
            iVar23 = iVar21;
          }
          iVar23 = (iVar23 * 10) / 0x2c;
        }
        if ((special_ok && 10 < iVar19) && (uVar6 = Rand_div(0x14), uVar6 == 0)) {
          uVar18 = 0xc;
          bVar27 = true;
        }
        else {
          uVar6 = Rand_div(7);
          uVar24 = ((iVar21 * iVar19) / 0x50 - uVar6) + 0xb;
          uVar26 = 8;
          if (8 < (int)uVar24) {
            uVar26 = uVar24;
          }
          uVar18 = 0x2d;
          if ((int)uVar26 < 0x2d) {
            uVar18 = (ulong)uVar26;
          }
          bVar27 = false;
        }
        uVar6 = (uint32_t)uVar18;
        iVar16 = iVar5 + 4;
        if (-1 < iVar21) {
          iVar16 = iVar21;
        }
        local_19c = iVar16 >> 2;
        iVar16 = iVar5 + 7;
        if (-1 < iVar5 + 4) {
          iVar16 = iVar5 + 4;
        }
        iVar5 = iVar4 + 4;
        if (-1 < iVar19) {
          iVar5 = iVar19;
        }
        iVar15 = iVar4 + 7;
        if (-1 < iVar4 + 4) {
          iVar15 = iVar4 + 4;
        }
        uVar22 = 0;
        uVar24 = 0xb4;
        uVar26 = uVar6 + 0xb4;
        wVar17 = L'\0';
        do {
          arc[uVar22][0] = wVar17;
          uVar7 = Rand_div(uVar6);
          wVar20 = (int)(uVar7 + 0xb4) / (int)uVar6 + wVar17;
          wVar8 = (wchar_t)(uVar24 / uVar18);
          if (wVar20 <= wVar8) {
            wVar20 = wVar8;
          }
          wVar8 = (wchar_t)(uVar26 / uVar18);
          if ((uint)wVar8 <= (uint)wVar20) {
            wVar20 = wVar8;
          }
          if ((uint)(wVar20 + L'\xffffffd2' + wVar17) < 0x59 ||
              (uint)(wVar20 + L'\xffffff1e' + wVar17) < 0x59) {
            uVar7 = Rand_div(iVar15 >> 2);
            wVar17 = uVar7 + (iVar5 >> 2);
LAB_0014f49d:
            arc[uVar22][1] = wVar17;
          }
          else {
            if ((uint)((wVar17 + wVar20) - 0x88U) < 0x59 ||
                (uint)((wVar17 + wVar20) - 0x13cU) < 0xfffffef1) {
              uVar7 = Rand_div(iVar16 >> 2);
              wVar17 = uVar7 + local_19c;
              goto LAB_0014f49d;
            }
            if (uVar22 != 0) {
              wVar17 = L'\0';
              if (!bVar27) {
                wVar17 = arc[uVar22 - 1][1];
                uVar7 = Rand_div(7);
                wVar17 = (wVar17 - uVar7) + L'\x03';
              }
              goto LAB_0014f49d;
            }
          }
          if ((uVar22 != 0 && !bVar27) && (uVar6 - 1 != uVar22)) {
            _Var2 = feat_is_smooth(feat);
            wVar17 = arc[uVar22 - 1][1];
            wVar8 = arc[uVar22][1];
            if (_Var2) {
              wVar14 = wVar17 + L'\x02';
              if (wVar8 < wVar17 + L'\x02') {
                wVar14 = wVar8;
              }
              wVar8 = wVar17 + L'\xfffffffe';
              if (wVar14 < wVar17 + L'\xfffffffe') {
                wVar8 = wVar14;
              }
            }
            else {
              wVar14 = (wVar17 * 3 - (wVar17 * 3 + 3 >> 0x1f)) + 3 >> 1;
              if (wVar8 < wVar14) {
                wVar14 = wVar8;
              }
              wVar8 = (wVar17 * 2 + -2) / 3;
              if (wVar8 < wVar14) {
                wVar8 = wVar14;
              }
            }
            arc[uVar22][1] = wVar8;
          }
          if (uVar6 - 1 == uVar22) {
            wVar17 = arc[uVar22][1];
            uVar7 = wVar17 - arc[0][1];
            uVar13 = -uVar7;
            if (0 < (int)uVar7) {
              uVar13 = uVar7;
            }
            if (3 < uVar13) {
              if (arc[0][1] < wVar17) {
                uVar7 = Rand_div(uVar7);
                uVar7 = -uVar7;
              }
              else {
                if (arc[0][1] <= wVar17) goto LAB_0014f561;
                uVar7 = Rand_div(arc[0][1] - wVar17);
              }
              arc[uVar22][1] = wVar17 + uVar7;
            }
          }
LAB_0014f561:
          uVar22 = uVar22 + 1;
          uVar26 = uVar26 + uVar6 + 0xb4;
          uVar24 = uVar24 + 0xb4;
          wVar17 = wVar20;
        } while (uVar18 != uVar22);
        local_200 = y1 + L'\x01';
        if (local_200 < y2) {
          iVar4 = iVar19 / 2 + y1;
          iVar5 = iVar21 / 2 + x1;
          wVar17 = local_200;
          do {
            if (x1 + L'\x01' < x2) {
              wVar20 = x1 + L'\x01';
              do {
                lVar9 = (loc)loc(wVar20,wVar17);
                _Var2 = square_isvault((chunk_conflict *)c,lVar9);
                if (((!_Var2) &&
                    (pmVar10 = square_monster((chunk_conflict *)c,lVar9), pmVar10 == (monster *)0x0)
                    ) && (poVar11 = square_object((chunk_conflict *)c,lVar9),
                         poVar11 == (object *)0x0)) {
                  grid1 = loc(iVar5,iVar4);
                  wVar8 = distance(grid1,(loc_conflict)lVar9);
                  if (wVar8 < (iVar23 * 0x15) / 10) {
                    iVar19 = ((wVar17 - iVar4) * 10) / iVar23;
                    iVar21 = ((wVar20 - iVar5) * 10) / iVar23;
                    if ((0xffffffd6 < iVar19 - 0x15U) && (0xffffffd6 < iVar21 - 0x15U)) {
                      uVar22 = uVar18;
                      do {
                        if ((long)uVar22 < 1) goto LAB_0014f81e;
                        uVar1 = uVar22 - 1;
                        lVar25 = uVar22 * 2;
                        uVar22 = uVar1;
                      } while ((int)(uint)get_angle_to_grid[iVar19 + 0x14][iVar21 + 0x14] <
                               (&iStack_1a0)[lVar25]);
                      wVar14 = arc[uVar1][1];
                      if (wVar8 <= wVar14) {
                        _Var2 = feat_is_floor(feat);
                        if ((_Var2) || (_Var2 = feat_is_passable(feat), !_Var2)) {
                          square_set_feat((chunk_conflict *)c,lVar9,feat);
                          _Var2 = feat_is_floor(feat);
                          psVar12 = square((chunk_conflict *)c,lVar9);
                          if (_Var2) {
                            flag_on_dbg(psVar12->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
                          }
                          else {
                            flag_off(psVar12->info,3,4);
                          }
                          if (light) goto LAB_0014f7f2;
                          _Var2 = square_isbright((chunk_conflict *)c,lVar9);
                          if (!_Var2) {
                            psVar12 = square((chunk_conflict *)c,lVar9);
                            flag_off(psVar12->info,3,2);
                          }
                        }
                        else {
                          _Var2 = feat_is_smooth(feat);
                          _Var3 = square_isfloor((chunk_conflict *)c,lVar9);
                          if (_Var2) {
                            if (_Var3) {
LAB_0014f7d9:
                              square_set_feat((chunk_conflict *)c,lVar9,feat);
                            }
                          }
                          else if ((_Var3) &&
                                  (uVar6 = Rand_div(wVar14 + L'\x05'), wVar8 + L'\x04' <= (int)uVar6
                                  )) goto LAB_0014f7d9;
                          if (light) {
LAB_0014f7f2:
                            psVar12 = square((chunk_conflict *)c,lVar9);
                            flag_on_dbg(psVar12->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
                          }
                        }
                      }
                    }
                  }
                }
LAB_0014f81e:
                wVar20 = wVar20 + L'\x01';
              } while (wVar20 != x2);
            }
            wVar17 = wVar17 + L'\x01';
          } while (wVar17 != y2);
        }
        _Var2 = feat_is_floor(feat);
        if (y2 <= local_200 || feat != L'\x15' && !_Var2) {
          return true;
        }
        do {
          wVar17 = x1 + L'\x01';
          if (x1 + L'\x01' < x2) {
            do {
              lVar9 = (loc)loc(wVar17,local_200);
              _Var2 = square_isfloor((chunk_conflict *)c,lVar9);
              if (_Var2) {
                lVar25 = 0;
                do {
                  grid = (loc)loc_sum((loc_conflict)lVar9,(loc_conflict)ddgrid_ddd[lVar25]);
                  psVar12 = square((chunk_conflict *)c,grid);
                  flag_on_dbg(psVar12->info,3,4,"square(c, grid1)->info","SQUARE_ROOM");
                  psVar12 = square((chunk_conflict *)c,grid);
                  flag_on_dbg(psVar12->info,3,0x14,"square(c, grid1)->info","SQUARE_NO_STAIRS");
                  if (light) {
                    psVar12 = square((chunk_conflict *)c,grid);
                    flag_on_dbg(psVar12->info,3,2,"square(c, grid1)->info","SQUARE_GLOW");
                  }
                  psVar12 = square((chunk_conflict *)c,grid);
                  if (psVar12->feat == '\x15') {
                    square_set_feat((chunk_conflict *)c,grid,L'\x15');
                    generate_mark(c,grid.y,grid.x,grid.y,grid.x,L'\f');
                  }
                  lVar25 = lVar25 + 1;
                } while (lVar25 != 8);
              }
              wVar17 = wVar17 + L'\x01';
            } while (wVar17 != x2);
          }
          local_200 = local_200 + L'\x01';
        } while (local_200 != y2);
      }
      return true;
    }
  }
  return false;
}

Assistant:

extern bool generate_starburst_room(struct chunk *c, int y1, int x1, int y2, 
									int x2, bool light, int feat, 
									bool special_ok)
{
	int y0, x0, y, x, ny, nx;
	int i, d;
	int dist, max_dist, dist_conv, dist_check;
	int height, width;
	int degree_first, center_of_arc, degree;

	/* Special variant room.  Discovered by accident. */
	bool make_cloverleaf = false;

	/* Holds first degree of arc, maximum effect distance in arc. */
	int arc[45][2];

	/* Number (max 45) of arcs. */
	int arc_num;

	/* Make certain the room does not cross the dungeon edge. */
	if ((!square_in_bounds(c, loc(x1, y1))) ||
		(!square_in_bounds(c, loc(x2, y2))))
		return (false);

	/* Robustness -- test sanity of input coordinates. */
	if ((y1 + 2 >= y2) || (x1 + 2 >= x2))
		return (false);


	/* Get room height and width. */
	height = 1 + y2 - y1;
	width = 1 + x2 - x1;


	/* Handle long, narrow rooms by dividing them up. */
	if ((height > 5 * width / 2) || (width > 5 * height / 2)) {
		int tmp_ay, tmp_ax, tmp_by, tmp_bx;

		/* Get bottom-left borders of the first room. */
		tmp_ay = y2;
		tmp_ax = x2;
		if (height > width)
			tmp_ay = y1 + 2 * height / 3;
		else
			tmp_ax = x1 + 2 * width / 3;

		/* Make the first room. */
		(void) generate_starburst_room(c, y1, x1, tmp_ay, tmp_ax, light, feat,
									   false);


		/* Get top_right borders of the second room. */
		tmp_by = y1;
		tmp_bx = x1;
		if (height > width)
			tmp_by = y1 + 1 * height / 3;
		else
			tmp_bx = x1 + 1 * width / 3;

		/* Make the second room. */
		(void) generate_starburst_room(c, tmp_by, tmp_bx, y2, x2, light, feat,
									   false);


		/* If floor, extend a "corridor" between room centers, to ensure 
		 * that the rooms are connected together. */
		if (feat_is_floor(feat)) {
			for (y = (y1 + tmp_ay) / 2; y <= (tmp_by + y2) / 2; y++) {
				for (x = (x1 + tmp_ax) / 2; x <= (tmp_bx + x2) / 2; x++) {
					square_set_feat(c, loc(x, y), feat);
				}
			}
		} else {
			/* Otherwise fill any gap between two starbursts. */
			int tmp_cy1, tmp_cx1, tmp_cy2, tmp_cx2;

			if (height > width) {
				tmp_cy1 = y1 + (height - width) / 2;
				tmp_cx1 = x1;
				tmp_cy2 = tmp_cy1 - (height - width) / 2;
				tmp_cx2 = x2;
			} else {
				tmp_cy1 = y1;
				tmp_cx1 = x1 + (width - height) / 2;
				tmp_cy2 = y2;
				tmp_cx2 = tmp_cx1 + (width - height) / 2;
			}

			/* Make the third room. */
			(void) generate_starburst_room(c, tmp_cy1, tmp_cx1, tmp_cy2,
										   tmp_cx2, light, feat, false);
		}

		/* Return. */
		return (true);
	}


	/* Get a shrinkage ratio for large rooms, as table is limited. */
	if ((width > 44) || (height > 44)) {
		if (width > height)
			dist_conv = 10 * width / 44;
		else
			dist_conv = 10 * height / 44;
	} else
		dist_conv = 10;


	/* Make a cloverleaf room sometimes. */
	if ((special_ok) && (height > 10) && (randint0(20) == 0)) {
		arc_num = 12;
		make_cloverleaf = true;
	}

	/* Usually, we make a normal starburst. */
	else {
		/* Ask for a reasonable number of arcs. */
		arc_num = 8 + (height * width / 80);
		arc_num = arc_num + 3 - randint0(7);
		if (arc_num < 8)
			arc_num = 8;
		if (arc_num > 45)
			arc_num = 45;
	}


	/* Get the center of the starburst. */
	y0 = y1 + height / 2;
	x0 = x1 + width / 2;

	/* Start out at zero degrees. */
	degree_first = 0;


	/* Determine the start degrees and expansion distance for each arc. */
	for (i = 0; i < arc_num; i++) {
		/* Get the first degree for this arc. */
		arc[i][0] = degree_first;

		/* Get a slightly randomized start degree for the next arc. */
		degree_first += (180 + randint0(arc_num)) / arc_num;
		if (degree_first < 180 * (i + 1) / arc_num)
			degree_first = 180 * (i + 1) / arc_num;
		if (degree_first > (180 + arc_num) * (i + 1) / arc_num)
			degree_first = (180 + arc_num) * (i + 1) / arc_num;


		/* Get the center of the arc. */
		center_of_arc = degree_first + arc[i][0];

		/* Calculate a reasonable distance to expand vertically. */
		if (((center_of_arc > 45) && (center_of_arc < 135))
			|| ((center_of_arc > 225) && (center_of_arc < 315))) {
			arc[i][1] = height / 4 + randint0((height + 3) / 4);
		}

		/* Calculate a reasonable distance to expand horizontally. */
		else if (((center_of_arc < 45) || (center_of_arc > 315))
				 || ((center_of_arc < 225) && (center_of_arc > 135))) {
			arc[i][1] = width / 4 + randint0((width + 3) / 4);
		}

		/* Handle arcs that count as neither vertical nor horizontal */
		else if (i != 0) {
			if (make_cloverleaf)
				arc[i][1] = 0;
			else
				arc[i][1] = arc[i - 1][1] + 3 - randint0(7);
		}


		/* Keep variability under control. */
		if ((!make_cloverleaf) && (i != 0) && (i != arc_num - 1)) {
			/* Water edges must be quite smooth. */
			if (feat_is_smooth(feat)) {
				if (arc[i][1] > arc[i - 1][1] + 2)
					arc[i][1] = arc[i - 1][1] + 2;

				if (arc[i][1] > arc[i - 1][1] - 2)
					arc[i][1] = arc[i - 1][1] - 2;
			} else {
				if (arc[i][1] > 3 * (arc[i - 1][1] + 1) / 2)
					arc[i][1] = 3 * (arc[i - 1][1] + 1) / 2;

				if (arc[i][1] < 2 * (arc[i - 1][1] - 1) / 3)
					arc[i][1] = 2 * (arc[i - 1][1] - 1) / 3;
			}
		}

		/* Neaten up final arc of circle by comparing it to the first. */
		if ((i == arc_num - 1) && (ABS(arc[i][1] - arc[0][1]) > 3)) {
			if (arc[i][1] > arc[0][1])
				arc[i][1] -= randint0(arc[i][1] - arc[0][1]);
			else if (arc[i][1] < arc[0][1])
				arc[i][1] += randint0(arc[0][1] - arc[i][1]);
		}
	}


	/* Precalculate check distance. */
	dist_check = 21 * dist_conv / 10;

	/* Change grids between (and not including) the edges. */
	for (y = y1 + 1; y < y2; y++) {
		for (x = x1 + 1; x < x2; x++) {
			struct loc grid = loc(x, y);

			/* Do not touch vault grids. */
			if (square_isvault(c, grid))
				continue;

			/* Do not touch occupied grids. */
			if (square_monster(c, grid))
				continue;
			if (square_object(c, grid))
				continue;

			/* Get distance to grid. */
			dist = distance(loc(x0, y0), grid);

			/* Reject grid if outside check distance. */
			if (dist >= dist_check) 
				continue;

			/* Convert and reorient grid for table access. */
			ny = 20 + 10 * (y - y0) / dist_conv;
			nx = 20 + 10 * (x - x0) / dist_conv;

			/* Illegal table access is bad. */
			if ((ny < 0) || (ny > 40) || (nx < 0) || (nx > 40))
				continue;

			/* Get angle to current grid. */
			degree = get_angle_to_grid[ny][nx];

			/* Scan arcs to find the one that applies here. */
			for (i = arc_num - 1; i >= 0; i--) {
				if (arc[i][0] <= degree) {
					max_dist = arc[i][1];

					/* Must be within effect range. */
					if (max_dist >= dist) {
						/* If new feature is not passable, or floor, always 
						 * place it. */
						if (feat_is_floor(feat) || !feat_is_passable(feat)) {
							square_set_feat(c, grid, feat);

							if (feat_is_floor(feat)) {
								sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
							} else {
								sqinfo_off(square(c, grid)->info, SQUARE_ROOM);
							}

							if (light) {
								sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
							} else if (!square_isbright(c, grid)) {
								sqinfo_off(square(c, grid)->info, SQUARE_GLOW);
							}
						}

						/* If new feature is non-floor passable terrain,
						 * place it only over floor. */
						else {
							/* Replace old feature entirely in some cases. */
							if (feat_is_smooth(feat)) {
								if (square_isfloor(c, grid))
									square_set_feat(c, grid, feat);
							} else {
								/* Make denser in the middle. */
								if (square_isfloor(c, grid) &&
									(randint1(max_dist + 5) >= dist + 5))
									square_set_feat(c, grid, feat);
							}

							/* Light grid. */
							if (light)
								sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
						}
					}

					/* Arc found.  End search */
					break;
				}
			}
		}
	}

	/*
	 * If we placed floors or dungeon granite, all dungeon granite next
	 * to floors needs to become outer wall.
	 */
	if (feat_is_floor(feat) || feat == FEAT_GRANITE) {
		for (y = y1 + 1; y < y2; y++) {
			for (x = x1 + 1; x < x2; x++) {

				struct loc grid = loc(x, y);
				/* Floor grids only */
				if (square_isfloor(c, grid)) {
					/* Look in all directions. */
					for (d = 0; d < 8; d++) {
						/* Extract adjacent location */
						struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

						/* Join to room, forbid stairs */
						sqinfo_on(square(c, grid1)->info, SQUARE_ROOM);
						sqinfo_on(square(c, grid1)->info, SQUARE_NO_STAIRS);

						/* Illuminate if requested. */
						if (light)
							sqinfo_on(square(c, grid1)->info, SQUARE_GLOW);

						/* Look for dungeon granite. */
						if (square(c, grid1)->feat == FEAT_GRANITE) {
							/* Mark as outer wall. */
							set_marked_granite(c, grid1, SQUARE_WALL_OUTER);
						}
					}
				}
			}
		}
	}

	/* Success */
	return (true);
}